

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeEventPoolGetContextHandle
          (ze_event_pool_handle_t hEventPool,ze_context_handle_t *phContext)

{
  ze_context_handle_t p_Var1;
  ze_pfnEventPoolGetContextHandle_t pfnGetContextHandle;
  ze_result_t result;
  ze_context_handle_t *phContext_local;
  ze_event_pool_handle_t hEventPool_local;
  
  pfnGetContextHandle._4_4_ = ZE_RESULT_SUCCESS;
  if (_DAT_0011c5c0 == (code *)0x0) {
    p_Var1 = (ze_context_handle_t)context_t::get((context_t *)&context);
    *phContext = p_Var1;
  }
  else {
    pfnGetContextHandle._4_4_ = (*_DAT_0011c5c0)(hEventPool,phContext);
  }
  return pfnGetContextHandle._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolGetContextHandle(
        ze_event_pool_handle_t hEventPool,              ///< [in] handle of the event pool
        ze_context_handle_t* phContext                  ///< [out] handle of the context on which the event pool was created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetContextHandle = context.zeDdiTable.EventPool.pfnGetContextHandle;
        if( nullptr != pfnGetContextHandle )
        {
            result = pfnGetContextHandle( hEventPool, phContext );
        }
        else
        {
            // generic implementation
            *phContext = reinterpret_cast<ze_context_handle_t>( context.get() );

        }

        return result;
    }